

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteComment(xmlTextWriterPtr writer,xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = xmlTextWriterStartComment(writer);
  iVar4 = -1;
  if (-1 < iVar1) {
    iVar2 = xmlTextWriterWriteString(writer,content);
    if (-1 < iVar2) {
      iVar3 = xmlTextWriterEndComment(writer);
      if (-1 < iVar3) {
        iVar4 = iVar2 + iVar1 + iVar3;
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlTextWriterWriteComment(xmlTextWriterPtr writer, const xmlChar * content)
{
    int count;
    int sum;

    DEBUG_ENTER(("xmlTextWriterWriteComment(%p, %s);\n", writer, content));

    sum = 0;
    count = xmlTextWriterStartComment(writer);
    if (count < 0)
        RETURN_INT(-1);
    sum += count;
    count = xmlTextWriterWriteString(writer, content);
    if (count < 0)
        RETURN_INT(-1);
    sum += count;
    count = xmlTextWriterEndComment(writer);
    if (count < 0)
        RETURN_INT(-1);
    sum += count;

    RETURN_INT(sum);
}